

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_transpose8x16_16x8_avx2(__m256i *x,__m256i *d)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i ww1;
  __m256i ww0;
  __m256i w3;
  __m256i w2;
  __m256i w1;
  __m256i w0;
  
  auVar1 = vpunpcklwd_avx2(*in_RDI,in_RDI[1]);
  auVar2 = vpunpcklwd_avx2(in_RDI[2],in_RDI[3]);
  auVar3 = vpunpcklwd_avx2(in_RDI[4],in_RDI[5]);
  auVar4 = vpunpcklwd_avx2(in_RDI[6],in_RDI[7]);
  auVar5 = vpunpckldq_avx2(auVar1,auVar2);
  auVar6 = vpunpckldq_avx2(auVar3,auVar4);
  auVar7 = vpunpcklqdq_avx2(auVar5,auVar6);
  *in_RSI = auVar7;
  auVar5 = vpunpckhqdq_avx2(auVar5,auVar6);
  in_RSI[1] = auVar5;
  auVar5 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar1 = vpunpckhdq_avx2(auVar3,auVar4);
  auVar2 = vpunpcklqdq_avx2(auVar5,auVar1);
  in_RSI[2] = auVar2;
  auVar5 = vpunpckhqdq_avx2(auVar5,auVar1);
  in_RSI[3] = auVar5;
  auVar5 = vpunpckhwd_avx2(*in_RDI,in_RDI[1]);
  auVar1 = vpunpckhwd_avx2(in_RDI[2],in_RDI[3]);
  auVar2 = vpunpckhwd_avx2(in_RDI[4],in_RDI[5]);
  auVar3 = vpunpckhwd_avx2(in_RDI[6],in_RDI[7]);
  auVar4 = vpunpckldq_avx2(auVar5,auVar1);
  auVar6 = vpunpckldq_avx2(auVar2,auVar3);
  auVar7 = vpunpcklqdq_avx2(auVar4,auVar6);
  in_RSI[4] = auVar7;
  auVar4 = vpunpckhqdq_avx2(auVar4,auVar6);
  in_RSI[5] = auVar4;
  auVar5 = vpunpckhdq_avx2(auVar5,auVar1);
  auVar1 = vpunpckhdq_avx2(auVar2,auVar3);
  auVar2 = vpunpcklqdq_avx2(auVar5,auVar1);
  in_RSI[6] = auVar2;
  auVar5 = vpunpckhqdq_avx2(auVar5,auVar1);
  in_RSI[7] = auVar5;
  return;
}

Assistant:

static inline void highbd_transpose8x16_16x8_avx2(__m256i *x, __m256i *d) {
  __m256i w0, w1, w2, w3, ww0, ww1;

  w0 = _mm256_unpacklo_epi16(x[0], x[1]);  // 00 10 01 11 02 12 03 13
  w1 = _mm256_unpacklo_epi16(x[2], x[3]);  // 20 30 21 31 22 32 23 33
  w2 = _mm256_unpacklo_epi16(x[4], x[5]);  // 40 50 41 51 42 52 43 53
  w3 = _mm256_unpacklo_epi16(x[6], x[7]);  // 60 70 61 71 62 72 63 73

  ww0 = _mm256_unpacklo_epi32(w0, w1);  // 00 10 20 30 01 11 21 31
  ww1 = _mm256_unpacklo_epi32(w2, w3);  // 40 50 60 70 41 51 61 71

  d[0] = _mm256_unpacklo_epi64(ww0, ww1);  // 00 10 20 30 40 50 60 70
  d[1] = _mm256_unpackhi_epi64(ww0, ww1);  // 01 11 21 31 41 51 61 71

  ww0 = _mm256_unpackhi_epi32(w0, w1);  // 02 12 22 32 03 13 23 33
  ww1 = _mm256_unpackhi_epi32(w2, w3);  // 42 52 62 72 43 53 63 73

  d[2] = _mm256_unpacklo_epi64(ww0, ww1);  // 02 12 22 32 42 52 62 72
  d[3] = _mm256_unpackhi_epi64(ww0, ww1);  // 03 13 23 33 43 53 63 73

  w0 = _mm256_unpackhi_epi16(x[0], x[1]);  // 04 14 05 15 06 16 07 17
  w1 = _mm256_unpackhi_epi16(x[2], x[3]);  // 24 34 25 35 26 36 27 37
  w2 = _mm256_unpackhi_epi16(x[4], x[5]);  // 44 54 45 55 46 56 47 57
  w3 = _mm256_unpackhi_epi16(x[6], x[7]);  // 64 74 65 75 66 76 67 77

  ww0 = _mm256_unpacklo_epi32(w0, w1);  // 04 14 24 34 05 15 25 35
  ww1 = _mm256_unpacklo_epi32(w2, w3);  // 44 54 64 74 45 55 65 75

  d[4] = _mm256_unpacklo_epi64(ww0, ww1);  // 04 14 24 34 44 54 64 74
  d[5] = _mm256_unpackhi_epi64(ww0, ww1);  // 05 15 25 35 45 55 65 75

  ww0 = _mm256_unpackhi_epi32(w0, w1);  // 06 16 26 36 07 17 27 37
  ww1 = _mm256_unpackhi_epi32(w2, w3);  // 46 56 66 76 47 57 67 77

  d[6] = _mm256_unpacklo_epi64(ww0, ww1);  // 06 16 26 36 46 56 66 76
  d[7] = _mm256_unpackhi_epi64(ww0, ww1);  // 07 17 27 37 47 57 67 77
}